

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Matcher::Matcher(Matcher *this,initializer_list<args::EitherFlag> in)

{
  size_type in_RCX;
  initializer_list<args::EitherFlag> flags;
  initializer_list<args::EitherFlag> flags_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  Matcher *local_68;
  iterator pEStack_60;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> local_58;
  Matcher *local_20;
  Matcher *this_local;
  initializer_list<args::EitherFlag> in_local;
  
  flags._M_array = (iterator)in._M_len;
  local_68 = (Matcher *)in._M_array;
  flags._M_len = in_RCX;
  pEStack_60 = flags._M_array;
  local_20 = this;
  this_local = local_68;
  in_local._M_array = flags._M_array;
  EitherFlag::GetShort(&local_58,(EitherFlag *)local_68,flags);
  flags_00._M_len = in_RCX;
  flags_00._M_array = in_local._M_array;
  EitherFlag::GetLong_abi_cxx11_(&local_a0,(EitherFlag *)this_local,flags_00);
  Matcher<std::unordered_set<char,std::hash<char>,std::equal_to<char>,std::allocator<char>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (this,&local_58,&local_a0);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_a0);
  std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
  ~unordered_set(&local_58);
  return;
}

Assistant:

Matcher(std::initializer_list<EitherFlag> in) :
                Matcher(EitherFlag::GetShort(in), EitherFlag::GetLong(in)) {}